

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2p_tests.cpp
# Opt level: O0

void __thiscall i2p_tests::listen_ok_accept_fail::test_method(listen_ok_accept_fail *this)

{
  Connection *in_RDI;
  long in_FS_OFFSET;
  size_t i;
  size_t num_sockets;
  DebugLogHelper debugloghelper25;
  DebugLogHelper debugloghelper24;
  DebugLogHelper debugloghelper23;
  DebugLogHelper debugloghelper22;
  Connection conn;
  Session session;
  Proxy sam_proxy;
  CService addr;
  CThreadInterrupt interrupt;
  CThreadInterrupt *in_stack_fffffffffffff938;
  undefined7 in_stack_fffffffffffff940;
  undefined1 in_stack_fffffffffffff947;
  undefined7 in_stack_fffffffffffff948;
  undefined1 in_stack_fffffffffffff94f;
  path *in_stack_fffffffffffff950;
  CThreadInterrupt *in_stack_fffffffffffff960;
  undefined7 in_stack_fffffffffffff968;
  undefined1 in_stack_fffffffffffff96f;
  lazy_ostream *in_stack_fffffffffffff970;
  undefined7 in_stack_fffffffffffff978;
  undefined1 in_stack_fffffffffffff97f;
  CThreadInterrupt *in_stack_fffffffffffff980;
  Connection *in_stack_fffffffffffff988;
  Session *in_stack_fffffffffffff990;
  Session *in_stack_fffffffffffff998;
  ulong local_638;
  Session *in_stack_fffffffffffff9e8;
  lazy_ostream local_5f8 [2];
  assertion_result local_5d8;
  lazy_ostream local_580 [2];
  assertion_result local_560 [2];
  undefined1 local_520 [38];
  undefined1 local_4fa [40];
  allocator<char> local_4d2 [40];
  allocator<char> local_4aa [41];
  allocator<char> local_481;
  __native_type *local_480;
  __native_type local_478 [24];
  undefined1 local_a0;
  undefined1 local_9f;
  undefined1 local_9e;
  undefined1 local_9d;
  undefined1 local_9c;
  undefined1 local_9b;
  undefined1 local_9a;
  undefined1 local_99;
  undefined1 local_98;
  undefined1 local_97;
  undefined1 local_96;
  undefined1 local_95;
  undefined1 local_94;
  undefined1 local_93;
  undefined1 local_92;
  undefined1 local_91;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_478[0].__align = 0;
  local_480 = local_478;
  std::function<std::unique_ptr<Sock,std::default_delete<Sock>>(int,int,int)>::operator=
            ((function<std::unique_ptr<Sock,_std::default_delete<Sock>_>_(int,_int,_int)> *)
             CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948),
             (anon_class_8_1_e5952607 *)
             CONCAT17(in_stack_fffffffffffff947,in_stack_fffffffffffff940));
  CThreadInterrupt::CThreadInterrupt(in_stack_fffffffffffff938);
  local_a0 = 0;
  local_9f = 0;
  local_9e = 0;
  local_9d = 0;
  local_9c = 0;
  local_9b = 0;
  local_9a = 0;
  local_99 = 0;
  local_98 = 0;
  local_97 = 0;
  local_96 = 0;
  local_95 = 0;
  local_94 = 0;
  local_93 = 0;
  local_92 = 0;
  local_91 = 1;
  CService::CService((CService *)CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948),
                     (in6_addr *)CONCAT17(in_stack_fffffffffffff947,in_stack_fffffffffffff940),
                     (uint16_t)((ulong)in_stack_fffffffffffff938 >> 0x30));
  Proxy::Proxy((Proxy *)CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948),
               (CService *)CONCAT17(in_stack_fffffffffffff947,in_stack_fffffffffffff940),
               SUB81((ulong)in_stack_fffffffffffff938 >> 0x38,0));
  ArgsManager::GetDataDirNet
            ((ArgsManager *)CONCAT17(in_stack_fffffffffffff947,in_stack_fffffffffffff940));
  fs::operator/(in_stack_fffffffffffff950,
                (char *)CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948));
  i2p::sam::Session::Session
            (in_stack_fffffffffffff998,&in_stack_fffffffffffff990->m_private_key_file,
             (Proxy *)in_stack_fffffffffffff988,in_stack_fffffffffffff980);
  fs::path::~path((path *)in_stack_fffffffffffff938);
  fs::path::~path((path *)in_stack_fffffffffffff938);
  i2p::Connection::Connection
            ((Connection *)CONCAT17(in_stack_fffffffffffff96f,in_stack_fffffffffffff968));
  for (local_638 = 0; local_638 < 5; local_638 = local_638 + 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff988,(char *)in_stack_fffffffffffff980,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffff97f,in_stack_fffffffffffff978));
    std::function<bool(std::__cxx11::string_const*)>::
    function<DebugLogHelper::DebugLogHelper(std::__cxx11::string,std::function<bool(std::__cxx11::string_const*)>)::_default_arg_1_::_lambda(std::__cxx11::string_const*)_1_,void>
              ((function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
                *)CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948),
               (anon_class_1_0_00000001 *)
               CONCAT17(in_stack_fffffffffffff947,in_stack_fffffffffffff940));
    DebugLogHelper::DebugLogHelper
              ((DebugLogHelper *)in_stack_fffffffffffff998,(string *)in_stack_fffffffffffff990,
               (MatchFn *)in_stack_fffffffffffff988);
    std::
    function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
    ::~function((function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
                 *)in_stack_fffffffffffff938);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff938);
    std::allocator<char>::~allocator(&local_481);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff988,(char *)in_stack_fffffffffffff980,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffff97f,in_stack_fffffffffffff978));
    std::function<bool(std::__cxx11::string_const*)>::
    function<DebugLogHelper::DebugLogHelper(std::__cxx11::string,std::function<bool(std::__cxx11::string_const*)>)::_default_arg_1_::_lambda(std::__cxx11::string_const*)_1_,void>
              ((function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
                *)CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948),
               (anon_class_1_0_00000001 *)
               CONCAT17(in_stack_fffffffffffff947,in_stack_fffffffffffff940));
    DebugLogHelper::DebugLogHelper
              ((DebugLogHelper *)in_stack_fffffffffffff998,(string *)in_stack_fffffffffffff990,
               (MatchFn *)in_stack_fffffffffffff988);
    std::
    function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
    ::~function((function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
                 *)in_stack_fffffffffffff938);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff938);
    std::allocator<char>::~allocator(local_4aa);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff988,(char *)in_stack_fffffffffffff980,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffff97f,in_stack_fffffffffffff978));
    in_stack_fffffffffffff998 = (Session *)(local_4fa + 2);
    std::function<bool(std::__cxx11::string_const*)>::
    function<DebugLogHelper::DebugLogHelper(std::__cxx11::string,std::function<bool(std::__cxx11::string_const*)>)::_default_arg_1_::_lambda(std::__cxx11::string_const*)_1_,void>
              ((function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
                *)CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948),
               (anon_class_1_0_00000001 *)
               CONCAT17(in_stack_fffffffffffff947,in_stack_fffffffffffff940));
    DebugLogHelper::DebugLogHelper
              ((DebugLogHelper *)in_stack_fffffffffffff998,(string *)in_stack_fffffffffffff990,
               (MatchFn *)in_stack_fffffffffffff988);
    std::
    function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
    ::~function((function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
                 *)in_stack_fffffffffffff938);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff938);
    std::allocator<char>::~allocator(local_4d2);
    in_stack_fffffffffffff990 = (Session *)local_4fa;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff988,(char *)in_stack_fffffffffffff980,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffff97f,in_stack_fffffffffffff978));
    in_stack_fffffffffffff988 = (Connection *)local_520;
    std::function<bool(std::__cxx11::string_const*)>::
    function<DebugLogHelper::DebugLogHelper(std::__cxx11::string,std::function<bool(std::__cxx11::string_const*)>)::_default_arg_1_::_lambda(std::__cxx11::string_const*)_1_,void>
              ((function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
                *)CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948),
               (anon_class_1_0_00000001 *)
               CONCAT17(in_stack_fffffffffffff947,in_stack_fffffffffffff940));
    DebugLogHelper::DebugLogHelper
              ((DebugLogHelper *)in_stack_fffffffffffff998,(string *)in_stack_fffffffffffff990,
               (MatchFn *)in_stack_fffffffffffff988);
    std::
    function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
    ::~function((function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
                 *)in_stack_fffffffffffff938);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff938);
    std::allocator<char>::~allocator((allocator<char> *)local_4fa);
    do {
      in_stack_fffffffffffff980 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)
                 CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948),
                 (pointer)CONCAT17(in_stack_fffffffffffff947,in_stack_fffffffffffff940),
                 (unsigned_long)in_stack_fffffffffffff938);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff938);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff97f,in_stack_fffffffffffff978),
                 (const_string *)in_stack_fffffffffffff970,
                 CONCAT17(in_stack_fffffffffffff96f,in_stack_fffffffffffff968),
                 (const_string *)in_stack_fffffffffffff960);
      in_stack_fffffffffffff97f =
           i2p::sam::Session::Listen(in_stack_fffffffffffff990,in_stack_fffffffffffff988);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948),
                 (bool)in_stack_fffffffffffff947);
      in_stack_fffffffffffff970 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)
                 CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948),
                 (pointer)CONCAT17(in_stack_fffffffffffff947,in_stack_fffffffffffff940),
                 (unsigned_long)in_stack_fffffffffffff938);
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff947,in_stack_fffffffffffff940),
                 (basic_cstring<const_char> *)in_stack_fffffffffffff938);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)
                 CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948),
                 (pointer)CONCAT17(in_stack_fffffffffffff947,in_stack_fffffffffffff940),
                 (unsigned_long)in_stack_fffffffffffff938);
      in_stack_fffffffffffff938 = (CThreadInterrupt *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_560,local_580,(const_string *)&stack0xfffffffffffffa60,0x80,REQUIRE,
                 CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_fffffffffffff938);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffff938);
      in_stack_fffffffffffff96f = boost::test_tools::tt_detail::dummy_cond();
    } while ((bool)in_stack_fffffffffffff96f);
    do {
      in_stack_fffffffffffff960 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)
                 CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948),
                 (pointer)CONCAT17(in_stack_fffffffffffff947,in_stack_fffffffffffff940),
                 (unsigned_long)in_stack_fffffffffffff938);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff938);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff97f,in_stack_fffffffffffff978),
                 (const_string *)in_stack_fffffffffffff970,
                 CONCAT17(in_stack_fffffffffffff96f,in_stack_fffffffffffff968),
                 (const_string *)in_stack_fffffffffffff960);
      i2p::sam::Session::Accept(in_stack_fffffffffffff9e8,in_RDI);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948),
                 (bool)in_stack_fffffffffffff947);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)
                 CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948),
                 (pointer)CONCAT17(in_stack_fffffffffffff947,in_stack_fffffffffffff940),
                 (unsigned_long)in_stack_fffffffffffff938);
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff947,in_stack_fffffffffffff940),
                 (basic_cstring<const_char> *)in_stack_fffffffffffff938);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)
                 CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948),
                 (pointer)CONCAT17(in_stack_fffffffffffff947,in_stack_fffffffffffff940),
                 (unsigned_long)in_stack_fffffffffffff938);
      in_stack_fffffffffffff938 = (CThreadInterrupt *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (&local_5d8,local_5f8,(const_string *)&stack0xfffffffffffff9e8,0x81,REQUIRE,
                 CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_fffffffffffff938);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffff938);
      in_stack_fffffffffffff94f = boost::test_tools::tt_detail::dummy_cond();
    } while ((bool)in_stack_fffffffffffff94f);
    DebugLogHelper::~DebugLogHelper((DebugLogHelper *)in_stack_fffffffffffff938);
    DebugLogHelper::~DebugLogHelper((DebugLogHelper *)in_stack_fffffffffffff938);
    DebugLogHelper::~DebugLogHelper((DebugLogHelper *)in_stack_fffffffffffff938);
    DebugLogHelper::~DebugLogHelper((DebugLogHelper *)in_stack_fffffffffffff938);
  }
  i2p::Connection::~Connection((Connection *)in_stack_fffffffffffff938);
  i2p::sam::Session::~Session
            ((Session *)CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948));
  Proxy::~Proxy((Proxy *)in_stack_fffffffffffff938);
  CService::~CService((CService *)in_stack_fffffffffffff938);
  CThreadInterrupt::~CThreadInterrupt(in_stack_fffffffffffff938);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(listen_ok_accept_fail)
{
    size_t num_sockets{0};
    CreateSock = [&num_sockets](int, int, int) {
        // clang-format off
        ++num_sockets;
        // First socket is the control socket for creating the session.
        if (num_sockets == 1) {
            return std::make_unique<StaticContentsSock>(
                // reply to HELLO
                "HELLO REPLY RESULT=OK VERSION=3.1\n"
                // reply to DEST GENERATE
                "DEST REPLY PUB=WnGOLXRBqHQhdVjFlWqRxJwz9hxx~2~wGc2Vplta1KhacY4tdEGodCF1WMWVapHEnDP2HHH~b~AZzZWmW1rUqFpxji10Qah0IXVYxZVqkcScM~Yccf9v8BnNlaZbWtSoWnGOLXRBqHQhdVjFlWqRxJwz9hxx~2~wGc2Vplta1KhacY4tdEGodCF1WMWVapHEnDP2HHH~b~AZzZWmW1rUqFpxji10Qah0IXVYxZVqkcScM~Yccf9v8BnNlaZbWtSoWnGOLXRBqHQhdVjFlWqRxJwz9hxx~2~wGc2Vplta1KhacY4tdEGodCF1WMWVapHEnDP2HHH~b~AZzZWmW1rUqFpxji10Qah0IXVYxZVqkcScM~Yccf9v8BnNlaZbWtSoWnGOLXRBqHQhdVjFlWqRxJwz9hxx~2~wGc2Vplta1KhacY4tdEGodCF1WMWVapHEnDP2HHH~b~AZzZWmW1rUqLE4SD-yjT48UNI7qiTUfIPiDitCoiTTz2cr4QGfw89rBQAEAAcAAA== PRIV=WnGOLXRBqHQhdVjFlWqRxJwz9hxx~2~wGc2Vplta1KhacY4tdEGodCF1WMWVapHEnDP2HHH~b~AZzZWmW1rUqFpxji10Qah0IXVYxZVqkcScM~Yccf9v8BnNlaZbWtSoWnGOLXRBqHQhdVjFlWqRxJwz9hxx~2~wGc2Vplta1KhacY4tdEGodCF1WMWVapHEnDP2HHH~b~AZzZWmW1rUqFpxji10Qah0IXVYxZVqkcScM~Yccf9v8BnNlaZbWtSoWnGOLXRBqHQhdVjFlWqRxJwz9hxx~2~wGc2Vplta1KhacY4tdEGodCF1WMWVapHEnDP2HHH~b~AZzZWmW1rUqFpxji10Qah0IXVYxZVqkcScM~Yccf9v8BnNlaZbWtSoWnGOLXRBqHQhdVjFlWqRxJwz9hxx~2~wGc2Vplta1KhacY4tdEGodCF1WMWVapHEnDP2HHH~b~AZzZWmW1rUqLE4SD-yjT48UNI7qiTUfIPiDitCoiTTz2cr4QGfw89rBQAEAAcAAOvuCIKTyv5f~1QgGq7XQl-IqBULTB5WzB3gw5yGPtd1p0AeoADrq1ccZggLPQ4ZLUsGK-HVw373rcTfvxrcuwenqVjiN4tbbYLWtP7xXGWj6fM6HyORhU63GphrjEePpMUHDHXd3o7pWGM-ieVVQSK~1MzF9P93pQWI3Do52EeNAayz4HbpPjNhVBzG1hUEFwznfPmUZBPuaOR4-uBm1NEWEuONlNOCctE4-U0Ukh94z-Qb55U5vXjR5G4apmBblr68t6Wm1TKlzpgFHzSqLryh3stWqrOKY1H0z9eZ2z1EkHFOpD5LyF6nf51e-lV7HLMl44TYzoEHK8RRVodtLcW9lacVdBpv~tOzlZERIiDziZODPETENZMz5oy9DQ7UUw==\n"
                // reply to SESSION CREATE
                "SESSION STATUS RESULT=OK\n"
                // dummy to avoid reporting EOF on the socket
                "a"
            );
        }
        // Subsequent sockets are for recreating the session or for listening and accepting incoming connections.
        if (num_sockets % 2 == 0) {
            // Replies to Listen() and Accept()
            return std::make_unique<StaticContentsSock>(
                // reply to HELLO
                "HELLO REPLY RESULT=OK VERSION=3.1\n"
                // reply to STREAM ACCEPT
                "STREAM STATUS RESULT=OK\n"
                // continued reply to STREAM ACCEPT, violating the protocol described at
                // https://geti2p.net/en/docs/api/samv3#Accept%20Response
                // should be base64, something like
                // "IchV608baDoXbqzQKSqFDmTXPVgoDbPAhZJvNRXXxi4hyFXrTxtoOhdurNApKoUOZNc9WCgNs8CFkm81FdfGLiHIVetPG2g6F26s0CkqhQ5k1z1YKA2zwIWSbzUV18YuIchV608baDoXbqzQKSqFDmTXPVgoDbPAhZJvNRXXxi4hyFXrTxtoOhdurNApKoUOZNc9WCgNs8CFkm81FdfGLiHIVetPG2g6F26s0CkqhQ5k1z1YKA2zwIWSbzUV18YuIchV608baDoXbqzQKSqFDmTXPVgoDbPAhZJvNRXXxi4hyFXrTxtoOhdurNApKoUOZNc9WCgNs8CFkm81FdfGLiHIVetPG2g6F26s0CkqhQ5k1z1YKA2zwIWSbzUV18YuIchV608baDoXbqzQKSqFDmTXPVgoDbPAhZJvNRXXxi4hyFXrTxtoOhdurNApKoUOZNc9WCgNs8CFkm81FdfGLlSreVaCuCS5sdb-8ToWULWP7kt~lRPDeUNxQMq3cRSBBQAEAAcAAA==\n"
                "STREAM STATUS RESULT=I2P_ERROR MESSAGE=\"Session was closed\"\n"
            );
        } else {
            // Another control socket, but without creating a destination (it is cached in the session).
            return std::make_unique<StaticContentsSock>(
                // reply to HELLO
                "HELLO REPLY RESULT=OK VERSION=3.1\n"
                // reply to SESSION CREATE
                "SESSION STATUS RESULT=OK\n"
                // dummy to avoid reporting EOF on the socket
                "a"
            );
        }
        // clang-format on
    };

    CThreadInterrupt interrupt;
    const CService addr{in6_addr(IN6ADDR_LOOPBACK_INIT), /*port=*/7656};
    const Proxy sam_proxy(addr, false);
    i2p::sam::Session session(gArgs.GetDataDirNet() / "test_i2p_private_key",
                              sam_proxy,
                              &interrupt);

    i2p::Connection conn;
    for (size_t i = 0; i < 5; ++i) {
        ASSERT_DEBUG_LOG("Creating persistent SAM session");
        ASSERT_DEBUG_LOG("Persistent SAM session" /* ... created */);
        ASSERT_DEBUG_LOG("Error accepting");
        ASSERT_DEBUG_LOG("Destroying SAM session");
        BOOST_REQUIRE(session.Listen(conn));
        BOOST_REQUIRE(!session.Accept(conn));
    }
}